

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O3

DdNode * Cudd_addResidue(DdManager *dd,int n,int m,int options,int top)

{
  int *piVar1;
  int index;
  void *pvVar2;
  void *pvVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  void *local_88 [4];
  void *local_68;
  int local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (0 < n || 1 < m) {
    pvVar2 = malloc((long)m << 3);
    if (pvVar2 != (void *)0x0) {
      local_88[0] = pvVar2;
      pvVar3 = malloc((long)m << 3);
      local_88[1] = pvVar3;
      if (pvVar3 != (void *)0x0) {
        local_50 = (ulong)(uint)top;
        uVar11 = (ulong)(uint)m;
        local_58 = (ulong)(uint)n;
        if (0 < m) {
          uVar10 = 0;
          memset(pvVar3,0,uVar11 * 8);
          n = (int)local_58;
          memset(pvVar2,0,uVar11 * 8);
          do {
            pDVar4 = cuddUniqueConst(dd,(double)(int)uVar10);
            if (pDVar4 == (DdNode *)0x0) {
              if (uVar10 != 0) {
                uVar11 = 0;
                do {
                  Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + uVar11 * 8));
                  uVar11 = uVar11 + 1;
                } while (uVar10 != uVar11);
              }
              free(pvVar2);
              goto LAB_007c4010;
            }
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            *(DdNode **)((long)pvVar3 + uVar10 * 8) = pDVar4;
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
        local_88[3] = pvVar2;
        local_68 = pvVar3;
        if (n < 1) {
LAB_007c3f2c:
          if (1 < m) {
            pvVar2 = local_88[~n & 1U];
            uVar10 = 1;
            do {
              Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + uVar10 * 8));
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
          }
          pDVar4 = *local_88[~n & 1U];
          free(local_88[3]);
          free(local_68);
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          return pDVar4;
        }
        local_5c = (int)local_50 + n;
        local_60 = n - 1;
        iVar6 = 1;
        uVar10 = 0;
LAB_007c3dfd:
        uVar9 = (uint)uVar10;
        uVar7 = uVar9 & 1 ^ 1;
        index = uVar9 + (int)local_50;
        if ((options & 1U) != 0) {
          index = ~uVar9 + local_5c;
        }
        local_38 = uVar10;
        pDVar4 = cuddUniqueInter(dd,index,dd->one,dd->zero);
        if (pDVar4 == (DdNode *)0x0) {
          if (0 < m) {
            pvVar2 = local_88[uVar7];
            uVar10 = 0;
            do {
              Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + uVar10 * 8));
              uVar10 = uVar10 + 1;
            } while (uVar11 != uVar10);
          }
LAB_007c3fd8:
          free(local_88[3]);
          pvVar3 = local_68;
LAB_007c4010:
          free(pvVar3);
          return (DdNode *)0x0;
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        if (0 < m) {
          local_40 = (ulong)uVar7;
          pvVar2 = local_88[uVar7];
          local_48 = (ulong)(uVar9 & 1);
          uVar10 = 0;
LAB_007c3e6e:
          pDVar5 = Cudd_addIte(dd,pDVar4,
                               *(DdNode **)((long)pvVar2 + (long)(((int)uVar10 + iVar6) % m) * 8),
                               *(DdNode **)((long)pvVar2 + uVar10 * 8));
          if (pDVar5 != (DdNode *)0x0) goto code_r0x007c3e95;
          if (uVar10 != 0) {
            pvVar3 = local_88[local_48];
            uVar8 = 0;
            do {
              Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + uVar8 * 8));
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
          }
          uVar10 = 0;
          do {
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + uVar10 * 8));
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
          goto LAB_007c3fd8;
        }
        goto LAB_007c3edd;
      }
      free(pvVar2);
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode *)0x0;
code_r0x007c3e95:
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  *(DdNode **)((long)local_88[local_48] + uVar10 * 8) = pDVar5;
  uVar10 = uVar10 + 1;
  if (uVar11 == uVar10) goto code_r0x007c3eb5;
  goto LAB_007c3e6e;
code_r0x007c3eb5:
  if (0 < m) {
    pvVar2 = local_88[local_40];
    uVar10 = 0;
    do {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + uVar10 * 8));
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
  }
LAB_007c3edd:
  Cudd_RecursiveDeref(dd,pDVar4);
  iVar6 = (iVar6 * 2) % m;
  if (((int)local_38 == local_60 & (byte)options >> 1) == 1) {
    iVar6 = (m - iVar6) % m;
  }
  uVar7 = (int)local_38 + 1;
  uVar10 = (ulong)uVar7;
  n = (int)local_58;
  if (uVar7 == n) goto LAB_007c3f2c;
  goto LAB_007c3dfd;
}

Assistant:

DdNode *
Cudd_addResidue(
  DdManager * dd /* manager */,
  int  n /* number of bits */,
  int  m /* modulus */,
  int  options /* options */,
  int  top /* index of top variable */)
{
    int msbLsb; /* MSB on top (1) or LSB on top (0) */
    int tc;     /* two's complement (1) or unsigned (0) */
    int i, j, k, t, residue, thisOne, previous, index;
    DdNode **array[2], *var, *tmp, *res;

    /* Sanity check. */
    if (n < 1 && m < 2) return(NULL);

    msbLsb = options & CUDD_RESIDUE_MSB;
    tc = options & CUDD_RESIDUE_TC;

    /* Allocate and initialize working arrays. */
    array[0] = ABC_ALLOC(DdNode *,m);
    if (array[0] == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    array[1] = ABC_ALLOC(DdNode *,m);
    if (array[1] == NULL) {
        ABC_FREE(array[0]);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < m; i++) {
        array[0][i] = array[1][i] = NULL;
    }

    /* Initialize residues. */
    for (i = 0; i < m; i++) {
        tmp = cuddUniqueConst(dd,(CUDD_VALUE_TYPE) i);
        if (tmp == NULL) {
            for (j = 0; j < i; j++) {
                Cudd_RecursiveDeref(dd,array[1][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(tmp);
        array[1][i] = tmp;
    }

    /* Main iteration. */
    residue = 1;        /* residue of 2**0 */
    for (k = 0; k < n; k++) {
        /* Choose current and previous arrays. */
        thisOne = k & 1;
        previous = thisOne ^ 1;
        /* Build an ADD projection function. */
        if (msbLsb) {
            index = top+n-k-1;
        } else {
            index = top+k;
        }
        var = cuddUniqueInter(dd,index,DD_ONE(dd),DD_ZERO(dd));
        if (var == NULL) {
            for (j = 0; j < m; j++) {
                Cudd_RecursiveDeref(dd,array[previous][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(var);
        for (i = 0; i < m; i ++) {
            t = (i + residue) % m;
            tmp = Cudd_addIte(dd,var,array[previous][t],array[previous][i]);
            if (tmp == NULL) {
                for (j = 0; j < i; j++) {
                    Cudd_RecursiveDeref(dd,array[thisOne][j]);
                }
                for (j = 0; j < m; j++) {
                    Cudd_RecursiveDeref(dd,array[previous][j]);
                }
                ABC_FREE(array[0]);
                ABC_FREE(array[1]);
                return(NULL);
            }
            cuddRef(tmp);
            array[thisOne][i] = tmp;
        }
        /* One layer completed. Free the other array for the next iteration. */
        for (i = 0; i < m; i++) {
            Cudd_RecursiveDeref(dd,array[previous][i]);
        }
        Cudd_RecursiveDeref(dd,var);
        /* Update residue of 2**k. */
        residue = (2 * residue) % m;
        /* Adjust residue for MSB, if this is a two's complement number. */
        if (tc && (k == n - 1)) {
            residue = (m - residue) % m;
        }
    }

    /* We are only interested in the 0-residue node of the top layer. */
    for (i = 1; i < m; i++) {
        Cudd_RecursiveDeref(dd,array[(n - 1) & 1][i]);
    }
    res = array[(n - 1) & 1][0];

    ABC_FREE(array[0]);
    ABC_FREE(array[1]);

    cuddDeref(res);
    return(res);

}